

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Fillet3::ArchiveOUT(ChFunction_Fillet3 *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Fillet3>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->end;
  local_30._name = "end";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->y1;
  local_48._name = "y1";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->y2;
  local_60._name = "y2";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->dy1;
  local_78._name = "dy1";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->dy2;
  local_90._name = "dy2";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  return;
}

Assistant:

void ChFunction_Fillet3::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Fillet3>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(end);
    marchive << CHNVP(y1);
    marchive << CHNVP(y2);
    marchive << CHNVP(dy1);
    marchive << CHNVP(dy2);
}